

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# arithmetic.cpp
# Opt level: O1

bool __thiscall PowerPos<0,_0,_0>::propagate(PowerPos<0,_0,_0> *this)

{
  bool bVar1;
  
  bVar1 = propagate_case_zero(this);
  if (bVar1) {
    bVar1 = propagate_case_one(this);
    if (bVar1) {
      bVar1 = propagate_z(this);
      if (bVar1) {
        bVar1 = propagate_x(this);
        if (bVar1) {
          bVar1 = propagate_y(this);
          return bVar1;
        }
      }
    }
  }
  return false;
}

Assistant:

bool propagate() override {
		// Check for case 0
		if (!propagate_case_zero()) {
			return false;
		}
		// Check for case 1
		if (!propagate_case_one()) {
			return false;
		}
		// Propagation on z
		if (!propagate_z()) {
			return false;
		}
		// Propagation on x
		if (!propagate_x()) {
			return false;
		}
		// Propagation on y
		if (!propagate_y()) {
			return false;
		}

		return true;
	}